

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

NewOrderSingle *
anon_unknown.dwarf_334836::createNewOrderSingle
          (NewOrderSingle *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  allocator<char> local_27b;
  CHAR local_27a;
  allocator<char> local_279;
  FieldBase local_278;
  STRING local_220;
  STRING local_200;
  FieldBase local_1e0;
  FieldBase local_188;
  FieldBase local_130;
  FieldBase local_d8;
  FieldBase local_80;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"ID",&local_279);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&local_278,&local_200);
  local_27a = '1';
  FIX::HandlInst::HandlInst((HandlInst *)&local_d8,&local_27a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"SYMBOL",&local_27b);
  FIX::Symbol::Symbol((Symbol *)&local_130,&local_220);
  FIX::Side::Side((Side *)&local_188,"11D");
  FIX::TransactTime::now();
  FIX::OrdType::OrdType((OrdType *)&local_80,"1D");
  FIX42::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)&local_278,(HandlInst *)&local_d8,
             (Symbol *)&local_130,(Side *)&local_188,(TransactTime *)&local_1e0,(OrdType *)&local_80
            );
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase(&local_130);
  std::__cxx11::string::~string((string *)&local_220);
  FIX::FieldBase::~FieldBase(&local_d8);
  FIX::FieldBase::~FieldBase(&local_278);
  std::__cxx11::string::~string((string *)&local_200);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_278,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_278,true);
  FIX::FieldBase::~FieldBase(&local_278);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_278,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_278,true);
  FIX::FieldBase::~FieldBase(&local_278);
  return __return_storage_ptr__;
}

Assistant:

FIX42::NewOrderSingle createNewOrderSingle(const char *sender, const char *target, int seq) {
  FIX42::NewOrderSingle newOrderSingle(
      ClOrdID("ID"),
      HandlInst('1'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      TransactTime::now(),
      OrdType(OrdType_MARKET));
  fillHeader(newOrderSingle.getHeader(), sender, target, seq);
  newOrderSingle.getHeader().setField(BodyLength(newOrderSingle.bodyLength()));
  newOrderSingle.getTrailer().setField(CheckSum(newOrderSingle.checkSum()));
  return newOrderSingle;
}